

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# between_expression.hpp
# Opt level: O2

string * __thiscall
duckdb::BetweenExpression::ToString<duckdb::BetweenExpression,duckdb::ParsedExpression>
          (string *__return_storage_ptr__,BetweenExpression *this,BetweenExpression *entry)

{
  pointer pPVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->input);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_38,pPVar1);
  ::std::operator+(&local_d8,"(",&local_38);
  ::std::operator+(&local_b8,&local_d8," BETWEEN ");
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->lower);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_f8,pPVar1);
  ::std::operator+(&local_98,&local_b8,&local_f8);
  ::std::operator+(&local_78,&local_98," AND ");
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->upper);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&bStack_118,pPVar1);
  ::std::operator+(&local_58,&local_78,&bStack_118);
  ::std::operator+(__return_storage_ptr__,&local_58,")");
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&bStack_118);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry) {
		return "(" + entry.input->ToString() + " BETWEEN " + entry.lower->ToString() + " AND " +
		       entry.upper->ToString() + ")";
	}